

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::Test::HasNonfatalFailure(void)

{
  pointer pTVar1;
  bool bVar2;
  pointer pTVar3;
  TestResult *pTVar4;
  int iVar5;
  
  UnitTest::GetInstance();
  pTVar4 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
  if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ != (TestInfo *)0x0) {
    pTVar4 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
  }
  pTVar3 = (pTVar4->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (pTVar4->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar3 == pTVar1) {
    bVar2 = false;
  }
  else {
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (uint)(pTVar3->type_ == kNonFatalFailure);
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar1);
    bVar2 = 0 < iVar5;
  }
  return bVar2;
}

Assistant:

bool Test::HasNonfatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->
      HasNonfatalFailure();
}